

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O3

void statement(object *proc,int retSize)

{
  item *x;
  item *x_00;
  object *y;
  object *fp;
  typeDesc *ptVar1;
  procFixStruct *ppVar2;
  procFixStruct *ppVar3;
  int iVar4;
  object **ppoVar5;
  int b;
  int op;
  char *msg;
  
  x = (item *)calloc(1,0x30);
  x_00 = (item *)calloc(1,0x30);
  if (currentSymbol < 0x25d) {
    if (currentSymbol == 0x1f5) {
      y = find();
      getSymbol();
      makeItem(x,y);
      selector(x);
      if (currentSymbol != 0x65) {
        if (x->mode == 0x2c4) {
          param(x_00);
          if (y->val < 7) {
            IOCall(x,x_00);
          }
          goto LAB_00107ed6;
        }
        if (x->mode != 0x2c0) {
          return;
        }
        ppoVar5 = &y->dsc;
        if (y->val < 0) {
          ppoVar5 = &(*ppoVar5)->next;
        }
        fp = *ppoVar5;
        if (currentSymbol == 0x12d) {
          getSymbol();
          while (currentSymbol != 0x12e) {
            while (fp = parameter(fp), currentSymbol == 0xcc) {
              getSymbol();
            }
          }
          getSymbol();
        }
        semicolon();
        iVar4 = pc;
        if (fp->cl == 0x2c1) {
          if (fp->val < 1) goto LAB_00107d7a;
        }
        else if (fp->cl != 0x2c5) {
LAB_00107d7a:
          ppVar3 = procFixList;
          if (y->val < 0) {
            do {
              ppVar2 = ppVar3;
              ppVar3 = ppVar2->next;
            } while (ppVar3 != (procFixStruct *)0x0);
            ppVar3 = (procFixStruct *)calloc(1,0x18);
            ppVar3->pos = iVar4;
            ppVar3->proc = y;
            ppVar2->next = ppVar3;
            iVar4 = 0;
          }
          else {
            iVar4 = x->a - pc;
          }
          put(0x2e,0,0,iVar4);
          return;
        }
        msg = "too few parameters";
        goto LAB_00107ef5;
      }
      getSymbol();
      if (currentSymbol != 0x26a) {
        if (currentSymbol == 0x1f8) {
          simpleExpression(x_00);
        }
        else {
          expression(x_00);
        }
        store(x,x_00);
        goto LAB_00107ed6;
      }
      ptVar1 = getType(x->typeIndex);
      if (ptVar1->form == 0x324) {
        if (x->mode == 0x2c6) {
          iVar4 = x->a;
          b = x->r;
          op = 0x34;
        }
        else {
          if (x->mode != 0x2c1) goto LAB_00107eee;
          if (x->lev == 0) {
            iVar4 = x->a + RISC_MEMSIZE;
          }
          else {
            iVar4 = x->a;
          }
          b = x->r;
          op = 0x24;
        }
        put(op,0,b,iVar4);
        regs[b] = 0;
        getSymbol();
LAB_00107ed6:
        semicolon();
        return;
      }
LAB_00107eee:
      msg = "incompatible NULL pointer assignment";
      goto LAB_00107ef5;
    }
    if (currentSymbol == 0x259) {
      getSymbol();
      iterationStatement(proc,retSize);
      return;
    }
    if (currentSymbol == 0x25a) {
      getSymbol();
      conditionalBranchStatement(proc,retSize);
      return;
    }
  }
  else {
    if (currentSymbol == 0x25d) {
      getSymbol();
      returnStatement(proc,retSize);
      return;
    }
    if (currentSymbol == 0x26b) {
      getSymbol();
      allocStatement();
      return;
    }
    if (currentSymbol == 0x26e) {
      getSymbol();
      exitStatement();
      return;
    }
  }
  msg = "unknown statement";
LAB_00107ef5:
  mark(msg);
  exit(-1);
}

Assistant:

procedure 
void statement(struct object *proc, int retSize)  {
	variable struct item *x; variable struct item *y;
	variable struct object *obj; variable struct object *procObj; variable struct object *par;
	variable struct typeDesc *type;
	variable bool cond; variable int jumpTo;
	x = NULL; y = NULL; obj = NULL; par = NULL; type = NULL; procObj = NULL; jumpTo = 0;
	cond = true;
	allocMem(x); allocMem(y);	
	if (currentSymbol == SYMBOL_IDENTIFIER) {
		obj = find();
		getSymbol();
		makeItem(x,obj);
		selector(x);
		if (currentSymbol == SYMBOL_ASSIGN) {
			getSymbol();
			if (currentSymbol == SYMBOL_CHARACTERLITERAL) {
				simpleExpression(y);
				store(x,y);
			} elsif (currentSymbol == SYMBOL_NULL) {
				type = getType(x->typeIndex);
				if (type->form == FORM_REF) {
					if (x->mode == CLASS_VAR) {
						if (x->lev == 0) {
							x->a = RISC_MEMSIZE + x->a;
						}
						put(RISC_STW,0,x->r,x->a);
					} elsif (x->mode == CLASS_IND) { 
						put(RISC_HSTW,0,x->r,x->a);
					} else {
						mark("incompatible NULL pointer assignment");
						exit(-1);
					}
					regs[x->r] = 0; /* free x->r */
				} else {
					mark("incompatible NULL pointer assignment");
					exit(-1);
				}
				getSymbol();
			} else 	{
				expression(y);
				store(x,y);
			}
			semicolon();
		} elsif (x->mode == CLASS_PROC) { 
			procObj = obj;
			if (procObj->val < 0) { /* prototype => dsc still points to head for further use */
				par = obj->dsc->next;
			} else {
				par = obj->dsc;
			}
			if (currentSymbol == SYMBOL_LPARAN) { 
				getSymbol(); 
				if (currentSymbol == SYMBOL_RPARAN) {
					getSymbol();
				} else {
					par = parameter(par);
					while (cond == true) {
						if (currentSymbol == SYMBOL_COMMA) {
							getSymbol();
						} elsif (currentSymbol == SYMBOL_RPARAN) {
							getSymbol();
							cond = false;
						}
						if (cond == true) {
							par = parameter(par);
						}
					}
				}
			}
			semicolon();
			if (isParameter(par) != true) {
				if (procObj->val < 0) { /* only prototype exists till now */
					addProcToFixList(pc,procObj);
					jumpTo = 0;
				} else {
					jumpTo = x->a - pc;
				}
				call(x,jumpTo);
			} else {
				mark("too few parameters");
				exit(-1);
			}
		} elsif (x->mode == CLASS_SPROC) { 
			param(y);
			if (obj->val <= 6) {
				IOCall(x,y);
			}
			semicolon();
		}
	}